

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O0

int capacity_expand(xvec_t *xv,size_t size)

{
  void *pvVar1;
  uchar *puVar2;
  void *new_data;
  size_t new_cap;
  size_t size_local;
  xvec_t *xv_local;
  
  new_data = (void *)(xv->capacity << 1);
  pvVar1 = (void *)(xv->size + size);
  if (new_data < pvVar1) {
    new_data = pvVar1;
  }
  puVar2 = (uchar *)realloc(xv->data,xv->val_size * (long)new_data);
  if (puVar2 == (uchar *)0x0) {
    xv_local._4_4_ = -1;
  }
  else {
    xv->capacity = (size_t)new_data;
    xv->data = puVar2;
    xv_local._4_4_ = 0;
  }
  return xv_local._4_4_;
}

Assistant:

static int capacity_expand(xvec_t* xv, size_t size)
{
    size_t new_cap = xv->capacity << 1; /* xs->capacity * 2; */
    void* new_data;

    size += xv->size;

    if (new_cap < size) new_cap = size;

    new_data = realloc(xv->data, xv->val_size * new_cap);

    if (new_data)
    {
        xv->capacity = new_cap;
        xv->data = new_data;
        return 0;
    }

    return -1;
}